

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::optional_caster<std::optional<kratos::EventControl>>::
       cast<std::optional<kratos::EventControl>const&>
                 (optional<kratos::EventControl> *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  handle *phVar2;
  EventControl *src_00;
  handle local_30;
  return_value_policy local_21;
  optional<kratos::EventControl> *poStack_20;
  return_value_policy policy_local;
  optional<kratos::EventControl> *src_local;
  handle parent_local;
  
  local_21 = policy;
  poStack_20 = src;
  src_local = (optional<kratos::EventControl> *)parent.m_ptr;
  bVar1 = std::optional::operator_cast_to_bool((optional *)src);
  if (bVar1) {
    local_21 = return_value_policy_override<std::optional<kratos::EventControl>,_void>::policy
                         (local_21);
    src_00 = std::optional<kratos::EventControl>::operator*(poStack_20);
    parent_local = type_caster_base<kratos::EventControl>::cast(src_00,local_21,(handle)src_local);
  }
  else {
    none::none((none *)&local_30);
    phVar2 = pybind11::handle::inc_ref(&local_30);
    parent_local.m_ptr = phVar2->m_ptr;
    none::~none((none *)&local_30);
  }
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(T_ &&src, return_value_policy policy, handle parent) {
        if (!src)
            return none().inc_ref();
        if (!std::is_lvalue_reference<T>::value) {
            policy = return_value_policy_override<T>::policy(policy);
        }
        return value_conv::cast(*std::forward<T_>(src), policy, parent);
    }